

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statistics.h
# Opt level: O1

void __thiscall CompilerStatistics::CompilerStatistics(CompilerStatistics *this)

{
  SmallArray<CompilerStatistics::Timer,_16U> *this_00;
  undefined8 *puVar1;
  uint uVar2;
  long lVar3;
  Timer *pTVar4;
  
  this_00 = &this->timers;
  lVar3 = 0x18;
  do {
    puVar1 = (undefined8 *)((long)(this->timers).little + lVar3 + -8);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)(this->timers).little + lVar3 + -0x18);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)((long)&(this->timers).little[0].keyName.end + lVar3) = 0;
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0x298);
  (this->timers).allocator = (Allocator *)0x0;
  pTVar4 = (this->timers).little;
  (this->timers).data = pTVar4;
  (this->timers).count = 0;
  (this->timers).max = 0x10;
  this->startTime = 0;
  this->finishTime = 0;
  if (pTVar4 != (Timer *)0x0) {
    uVar2 = (this->timers).count;
    (this->timers).count = uVar2 + 1;
    pTVar4[uVar2].keyName.begin = "Lexer";
    (this->timers).little[uVar2].keyName.end = "";
    (this->timers).little[uVar2].outputName.begin = "lexer";
    (this->timers).little[uVar2].outputName.end = "";
    (this->timers).little[uVar2].total = 0;
    uVar2 = (this->timers).count;
    if (uVar2 == (this->timers).max) {
      SmallArray<CompilerStatistics::Timer,_16U>::grow(this_00,uVar2);
    }
    pTVar4 = this_00->data;
    if (pTVar4 != (Timer *)0x0) {
      uVar2 = (this->timers).count;
      (this->timers).count = uVar2 + 1;
      pTVar4[uVar2].keyName.begin = "Parse";
      pTVar4[uVar2].keyName.end = "";
      pTVar4[uVar2].outputName.begin = "parse";
      pTVar4[uVar2].outputName.end = "";
      pTVar4[uVar2].total = 0;
      uVar2 = (this->timers).count;
      if (uVar2 == (this->timers).max) {
        SmallArray<CompilerStatistics::Timer,_16U>::grow(this_00,uVar2);
      }
      pTVar4 = this_00->data;
      if (pTVar4 != (Timer *)0x0) {
        uVar2 = (this->timers).count;
        (this->timers).count = uVar2 + 1;
        pTVar4[uVar2].keyName.begin = "Import";
        pTVar4[uVar2].keyName.end = "";
        pTVar4[uVar2].outputName.begin = "import";
        pTVar4[uVar2].outputName.end = "";
        pTVar4[uVar2].total = 0;
        uVar2 = (this->timers).count;
        if (uVar2 == (this->timers).max) {
          SmallArray<CompilerStatistics::Timer,_16U>::grow(this_00,uVar2);
        }
        pTVar4 = this_00->data;
        if (pTVar4 != (Timer *)0x0) {
          uVar2 = (this->timers).count;
          (this->timers).count = uVar2 + 1;
          pTVar4[uVar2].keyName.begin = "Expressions";
          pTVar4[uVar2].keyName.end = "";
          pTVar4[uVar2].outputName.begin = "analyze";
          pTVar4[uVar2].outputName.end = "";
          pTVar4[uVar2].total = 0;
          uVar2 = (this->timers).count;
          if (uVar2 == (this->timers).max) {
            SmallArray<CompilerStatistics::Timer,_16U>::grow(this_00,uVar2);
          }
          pTVar4 = this_00->data;
          if (pTVar4 != (Timer *)0x0) {
            uVar2 = (this->timers).count;
            (this->timers).count = uVar2 + 1;
            pTVar4[uVar2].keyName.begin = "Finalization";
            pTVar4[uVar2].keyName.end = "";
            pTVar4[uVar2].outputName.begin = "(finalize)";
            pTVar4[uVar2].outputName.end = "";
            pTVar4[uVar2].total = 0;
            uVar2 = (this->timers).count;
            if (uVar2 == (this->timers).max) {
              SmallArray<CompilerStatistics::Timer,_16U>::grow(this_00,uVar2);
            }
            pTVar4 = this_00->data;
            if (pTVar4 != (Timer *)0x0) {
              uVar2 = (this->timers).count;
              (this->timers).count = uVar2 + 1;
              pTVar4[uVar2].keyName.begin = "Cleanup";
              pTVar4[uVar2].keyName.end = "";
              pTVar4[uVar2].outputName.begin = "(cleanup)";
              pTVar4[uVar2].outputName.end = "";
              pTVar4[uVar2].total = 0;
              uVar2 = (this->timers).count;
              if (uVar2 == (this->timers).max) {
                SmallArray<CompilerStatistics::Timer,_16U>::grow(this_00,uVar2);
              }
              pTVar4 = this_00->data;
              if (pTVar4 != (Timer *)0x0) {
                uVar2 = (this->timers).count;
                (this->timers).count = uVar2 + 1;
                pTVar4[uVar2].keyName.begin = "IrCodeGen";
                pTVar4[uVar2].keyName.end = "";
                pTVar4[uVar2].outputName.begin = "codegen";
                pTVar4[uVar2].outputName.end = "";
                pTVar4[uVar2].total = 0;
                uVar2 = (this->timers).count;
                if (uVar2 == (this->timers).max) {
                  SmallArray<CompilerStatistics::Timer,_16U>::grow(this_00,uVar2);
                }
                pTVar4 = this_00->data;
                if (pTVar4 != (Timer *)0x0) {
                  uVar2 = (this->timers).count;
                  (this->timers).count = uVar2 + 1;
                  pTVar4[uVar2].keyName.begin = "LlvmCodeGen";
                  pTVar4[uVar2].keyName.end = "";
                  pTVar4[uVar2].outputName.begin = "llvm";
                  pTVar4[uVar2].outputName.end = "";
                  pTVar4[uVar2].total = 0;
                  uVar2 = (this->timers).count;
                  if (uVar2 == (this->timers).max) {
                    SmallArray<CompilerStatistics::Timer,_16U>::grow(this_00,uVar2);
                  }
                  pTVar4 = this_00->data;
                  if (pTVar4 != (Timer *)0x0) {
                    uVar2 = (this->timers).count;
                    (this->timers).count = uVar2 + 1;
                    pTVar4[uVar2].keyName.begin = "IrOptimization";
                    pTVar4[uVar2].keyName.end = "";
                    pTVar4[uVar2].outputName.begin = "optimization";
                    pTVar4[uVar2].outputName.end = "";
                    pTVar4[uVar2].total = 0;
                    uVar2 = (this->timers).count;
                    if (uVar2 == (this->timers).max) {
                      SmallArray<CompilerStatistics::Timer,_16U>::grow(this_00,uVar2);
                    }
                    pTVar4 = this_00->data;
                    if (pTVar4 != (Timer *)0x0) {
                      uVar2 = (this->timers).count;
                      (this->timers).count = uVar2 + 1;
                      pTVar4[uVar2].keyName.begin = "IrFinalization";
                      pTVar4[uVar2].keyName.end = "";
                      pTVar4[uVar2].outputName.begin = "(finalize)";
                      pTVar4[uVar2].outputName.end = "";
                      pTVar4[uVar2].total = 0;
                      uVar2 = (this->timers).count;
                      if (uVar2 == (this->timers).max) {
                        SmallArray<CompilerStatistics::Timer,_16U>::grow(this_00,uVar2);
                      }
                      pTVar4 = this_00->data;
                      if (pTVar4 != (Timer *)0x0) {
                        uVar2 = (this->timers).count;
                        (this->timers).count = uVar2 + 1;
                        pTVar4[uVar2].keyName.begin = "IrLowering";
                        pTVar4[uVar2].keyName.end = "";
                        pTVar4[uVar2].outputName.begin = "lower";
                        pTVar4[uVar2].outputName.end = "";
                        pTVar4[uVar2].total = 0;
                        uVar2 = (this->timers).count;
                        if (uVar2 == (this->timers).max) {
                          SmallArray<CompilerStatistics::Timer,_16U>::grow(this_00,uVar2);
                        }
                        pTVar4 = this_00->data;
                        if (pTVar4 != (Timer *)0x0) {
                          uVar2 = (this->timers).count;
                          (this->timers).count = uVar2 + 1;
                          pTVar4[uVar2].keyName.begin = "Bytecode";
                          pTVar4[uVar2].keyName.end = "";
                          pTVar4[uVar2].outputName.begin = "bytecode";
                          pTVar4[uVar2].outputName.end = "";
                          pTVar4[uVar2].total = 0;
                          uVar2 = (this->timers).count;
                          if (uVar2 == (this->timers).max) {
                            SmallArray<CompilerStatistics::Timer,_16U>::grow(this_00,uVar2);
                          }
                          pTVar4 = this_00->data;
                          if (pTVar4 != (Timer *)0x0) {
                            uVar2 = (this->timers).count;
                            (this->timers).count = uVar2 + 1;
                            pTVar4[uVar2].keyName.begin = "BytecodeCache";
                            pTVar4[uVar2].keyName.end = "";
                            pTVar4[uVar2].outputName.begin = "(cache)";
                            pTVar4[uVar2].outputName.end = "";
                            pTVar4[uVar2].total = 0;
                            uVar2 = (this->timers).count;
                            if (uVar2 == (this->timers).max) {
                              SmallArray<CompilerStatistics::Timer,_16U>::grow(this_00,uVar2);
                            }
                            pTVar4 = this_00->data;
                            if (pTVar4 != (Timer *)0x0) {
                              uVar2 = (this->timers).count;
                              (this->timers).count = uVar2 + 1;
                              pTVar4[uVar2].keyName.begin = "Logging";
                              pTVar4[uVar2].keyName.end = "";
                              pTVar4[uVar2].outputName.begin = "logs";
                              pTVar4[uVar2].outputName.end = "";
                              pTVar4[uVar2].total = 0;
                              uVar2 = (this->timers).count;
                              if (uVar2 == (this->timers).max) {
                                SmallArray<CompilerStatistics::Timer,_16U>::grow(this_00,uVar2);
                              }
                              pTVar4 = this_00->data;
                              if (pTVar4 != (Timer *)0x0) {
                                uVar2 = (this->timers).count;
                                (this->timers).count = uVar2 + 1;
                                pTVar4[uVar2].keyName.begin = "Tracing";
                                pTVar4[uVar2].keyName.end = "";
                                pTVar4[uVar2].outputName.begin = "trace";
                                pTVar4[uVar2].outputName.end = "";
                                pTVar4[uVar2].total = 0;
                                uVar2 = (this->timers).count;
                                if (uVar2 == (this->timers).max) {
                                  SmallArray<CompilerStatistics::Timer,_16U>::grow(this_00,uVar2);
                                }
                                pTVar4 = this_00->data;
                                if (pTVar4 != (Timer *)0x0) {
                                  uVar2 = (this->timers).count;
                                  (this->timers).count = uVar2 + 1;
                                  pTVar4[uVar2].keyName.begin = "Extra";
                                  pTVar4[uVar2].keyName.end = "";
                                  pTVar4[uVar2].outputName.begin = "extra";
                                  pTVar4[uVar2].outputName.end = "";
                                  pTVar4[uVar2].total = 0;
                                  return;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,
                "void SmallArray<CompilerStatistics::Timer, 16>::push_back(const T &) [T = CompilerStatistics::Timer, N = 16]"
               );
}

Assistant:

CompilerStatistics()
	{
		startTime = 0;
		finishTime = 0;

		timers.push_back(Timer("Lexer", "lexer"));
		timers.push_back(Timer("Parse", "parse"));

		timers.push_back(Timer("Import", "import"));
		timers.push_back(Timer("Expressions", "analyze"));
		timers.push_back(Timer("Finalization", "(finalize)"));
		timers.push_back(Timer("Cleanup", "(cleanup)"));

		timers.push_back(Timer("IrCodeGen", "codegen"));
		timers.push_back(Timer("LlvmCodeGen", "llvm"));
		timers.push_back(Timer("IrOptimization", "optimization"));
		timers.push_back(Timer("IrFinalization", "(finalize)"));
		timers.push_back(Timer("IrLowering", "lower"));
		timers.push_back(Timer("Bytecode", "bytecode"));
		timers.push_back(Timer("BytecodeCache", "(cache)"));

		timers.push_back(Timer("Logging", "logs"));
		timers.push_back(Timer("Tracing", "trace"));
		timers.push_back(Timer("Extra", "extra"));
	}